

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

int fiorso(voccxdef *vctx,char *fname)

{
  ushort *puVar1;
  ushort uVar2;
  mcmcxdef *ctx;
  bool bVar3;
  mcmon objnum;
  undefined2 uVar4;
  ushort uVar5;
  objnum objn;
  uchar uVar6;
  uchar uVar7;
  voccxdef *pvVar8;
  int iVar9;
  FILE *__stream;
  size_t sVar10;
  uchar *puVar11;
  uint16_t tmp_1;
  uint16_t tmp;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uchar buf [21];
  ushort newsiz;
  voccxdef *local_b8;
  ulong local_b0;
  char timestamp [26];
  objnum sc;
  uchar local_86 [86];
  
  ctx = vctx->voccxmem;
  __stream = fopen(fname,"rb");
  if (__stream == (FILE *)0x0) {
    return 1;
  }
  sVar10 = fread(buf,0x12,1,__stream);
  if ((sVar10 == 1) &&
     (auVar16[0] = -(buf[0] == 'T'), auVar16[1] = -(buf[1] == 'A'), auVar16[2] = -(buf[2] == 'D'),
     auVar16[3] = -(buf[3] == 'S'), auVar16[4] = -(buf[4] == '2'), auVar16[5] = -(buf[5] == ' '),
     auVar16[6] = -(buf[6] == 's'), auVar16[7] = -(buf[7] == 'a'), auVar16[8] = -(buf[8] == 'v'),
     auVar16[9] = -(buf[9] == 'e'), auVar16[10] = -(buf[10] == '/'),
     auVar16[0xb] = -(buf[0xb] == 'g'), auVar16[0xc] = -(buf[0xc] == '\n'),
     auVar16[0xd] = -(buf[0xd] == '\r'), auVar16[0xe] = -(buf[0xe] == '\x1a'),
     auVar16[0xf] = -(buf[0xf] == '\0'),
     (ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe | (ushort)(auVar16[0xf] >> 7) << 0xf)
     == 0xffff)) {
    uVar13 = (ulong)CONCAT11(buf[0x11],buf[0x10]);
    iVar14 = 1;
  }
  else {
    uVar13 = 0;
    iVar14 = 0;
  }
  fseek(__stream,uVar13,iVar14);
  sVar10 = fread(buf,0x15,1,__stream);
  iVar14 = 2;
  if ((sVar10 == 1) &&
     (CONCAT17(buf[0xd],CONCAT16(buf[0xc],CONCAT15(buf[0xb],CONCAT14(buf[10],CONCAT13(buf[9],
                                                  CONCAT12(buf[8],CONCAT11(buf[7],buf[6]))))))) ==
      0x1a0d0a65766173 &&
      CONCAT17(buf[7],CONCAT16(buf[6],CONCAT15(buf[5],CONCAT14(buf[4],CONCAT13(buf[3],CONCAT12(buf[2
                                                  ],CONCAT11(buf[1],buf[0]))))))) ==
      0x6173203253444154)) {
    bVar3 = CONCAT13(buf[0x11],CONCAT12(buf[0x10],CONCAT11(buf[0xf],buf[0xe]))) == 0x322e3276;
    if ((buf._17_4_ == 0x312e32 && bVar3) ||
       (iVar14 = 3,
       buf._17_4_ == 0x302e32 &&
       CONCAT13(buf[0x11],CONCAT12(buf[0x10],CONCAT11(buf[0xf],buf[0xe]))) == 0x322e3276)) {
      sVar10 = fread(timestamp,0x1a,1,__stream);
      iVar14 = 4;
      if ((sVar10 == 1) &&
         (auVar17[0] = -(vctx->voccxtim[0] == timestamp[0]),
         auVar17[1] = -(vctx->voccxtim[1] == timestamp[1]),
         auVar17[2] = -(vctx->voccxtim[2] == timestamp[2]),
         auVar17[3] = -(vctx->voccxtim[3] == timestamp[3]),
         auVar17[4] = -(vctx->voccxtim[4] == timestamp[4]),
         auVar17[5] = -(vctx->voccxtim[5] == timestamp[5]),
         auVar17[6] = -(vctx->voccxtim[6] == timestamp[6]),
         auVar17[7] = -(vctx->voccxtim[7] == timestamp[7]),
         auVar17[8] = -(vctx->voccxtim[8] == timestamp[8]),
         auVar17[9] = -(vctx->voccxtim[9] == timestamp[9]),
         auVar17[10] = -(vctx->voccxtim[10] == timestamp[10]),
         auVar17[0xb] = -(vctx->voccxtim[0xb] == timestamp[0xb]),
         auVar17[0xc] = -(vctx->voccxtim[0xc] == timestamp[0xc]),
         auVar17[0xd] = -(vctx->voccxtim[0xd] == timestamp[0xd]),
         auVar17[0xe] = -(vctx->voccxtim[0xe] == timestamp[0xe]),
         auVar17[0xf] = -(vctx->voccxtim[0xf] == timestamp[0xf]),
         auVar18[0] = -(vctx->voccxtim[10] == timestamp[10]),
         auVar18[1] = -(vctx->voccxtim[0xb] == timestamp[0xb]),
         auVar18[2] = -(vctx->voccxtim[0xc] == timestamp[0xc]),
         auVar18[3] = -(vctx->voccxtim[0xd] == timestamp[0xd]),
         auVar18[4] = -(vctx->voccxtim[0xe] == timestamp[0xe]),
         auVar18[5] = -(vctx->voccxtim[0xf] == timestamp[0xf]),
         auVar18[6] = -(vctx->voccxtim[0x10] == timestamp[0x10]),
         auVar18[7] = -(vctx->voccxtim[0x11] == timestamp[0x11]),
         auVar18[8] = -(vctx->voccxtim[0x12] == timestamp[0x12]),
         auVar18[9] = -(vctx->voccxtim[0x13] == timestamp[0x13]),
         auVar18[10] = -(vctx->voccxtim[0x14] == timestamp[0x14]),
         auVar18[0xb] = -(vctx->voccxtim[0x15] == timestamp[0x15]),
         auVar18[0xc] = -(vctx->voccxtim[0x16] == timestamp[0x16]),
         auVar18[0xd] = -(vctx->voccxtim[0x17] == timestamp[0x17]),
         auVar18[0xe] = -(vctx->voccxtim[0x18] == timestamp[0x18]),
         auVar18[0xf] = -(vctx->voccxtim[0x19] == timestamp[0x19]), auVar17 = auVar17 & auVar18,
         (ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff)) {
        vocrevert(vctx);
        iVar14 = 5;
        local_b8 = vctx;
        while (pvVar8 = local_b8, sVar10 = fread(buf,7,1,__stream), uVar7 = buf[2], uVar6 = buf[1],
              sVar10 == 1) {
          objnum = CONCAT11(buf[2],buf[1]);
          if (objnum == 0xffff) {
            iVar9 = fiorfda((osfildef *)__stream,pvVar8->voccxdmn,pvVar8->voccxdmc);
            if (((iVar9 == 0) &&
                (iVar9 = fiorfda((osfildef *)__stream,pvVar8->voccxfus,pvVar8->voccxfuc), iVar9 == 0
                )) && (iVar9 = fiorfda((osfildef *)__stream,pvVar8->voccxalm,pvVar8->voccxalc),
                      iVar9 == 0)) goto LAB_00212e95;
            break;
          }
          if (buf[0] == '\x01') {
            uVar2 = CONCAT11(buf[4],buf[3]);
            puVar11 = mcmalo0(ctx,uVar2,(mcmon *)0x0,objnum,0);
            sVar10 = fread(puVar11,(ulong)uVar2,1,__stream);
            if (sVar10 != 1) break;
            if (*(ushort *)(puVar11 + 4) != 0) {
              sc = *(objnum *)(puVar11 + 0xe);
            }
            vociadd(local_b8,objnum,0xffff,(uint)*(ushort *)(puVar11 + 4),&sc,0x12);
            bVar15 = true;
            uVar13 = (ulong)uVar6;
          }
          else {
            uVar4 = CONCAT11(buf[4],buf[3]);
            uVar5 = CONCAT11(buf[6],buf[5]);
            puVar11 = mcmlck(ctx,objnum);
            local_b0 = (ulong)uVar6;
            uVar2 = *(ushort *)(puVar11 + 0xc);
            uVar12 = (uint)ctx->mcmcxgl->mcmcxtab[ctx->mcmcxmtb[uVar7][uVar6] >> 8]
                           [(byte)ctx->mcmcxmtb[uVar7][uVar6]].mcmosiz - (uint)uVar2;
            if (uVar12 < uVar5) {
              newsiz = uVar5 - (short)uVar12;
              puVar11 = objexp(ctx,objnum,&newsiz);
              uVar2 = *(ushort *)(puVar11 + 0xc);
            }
            *(undefined2 *)(puVar11 + 6) = uVar4;
            *(ushort *)(puVar11 + 8) = uVar2 + uVar5;
            sVar10 = fread(puVar11 + uVar2,(ulong)uVar5,1,__stream);
            bVar15 = sVar10 == 1;
            objsetign(ctx,objnum);
            uVar13 = local_b0;
          }
          puVar1 = &ctx->mcmcxgl->mcmcxtab[ctx->mcmcxmtb[uVar7][uVar13] >> 8]
                    [(byte)ctx->mcmcxmtb[uVar7][uVar13]].mcmoflg;
          *puVar1 = *puVar1 | 1;
          mcmunlck(ctx,objnum);
          if (!bVar15) break;
        }
      }
    }
  }
  goto LAB_00212b9f;
LAB_00212e95:
  sVar10 = fread(buf,8,1,__stream);
  uVar6 = buf[1];
  if (sVar10 == 1) {
    objn = CONCAT11(buf[7],buf[6]);
    if (objn == 0xffff) {
      if (buf._17_4_ == 0x312e32 && bVar3) {
        sVar10 = fread(buf,2,1,__stream);
        if (sVar10 != 1) goto LAB_00212b9f;
        local_b8->voccxme = CONCAT11(buf[1],buf[0]);
      }
      iVar14 = 0;
      goto LAB_00212b9f;
    }
    local_b0 = CONCAT44(local_b0._4_4_,(uint)buf[0]);
    uVar2 = CONCAT11(buf[3],buf[2]);
    uVar13 = (ulong)uVar2;
    uVar5 = CONCAT11(buf[5],buf[4]);
    sVar10 = fread(local_86,uVar13,1,__stream);
    if (sVar10 != 1) goto LAB_00212b9f;
    if ((ulong)uVar5 == 0) {
      sc = uVar2 + 2;
    }
    else {
      local_86[uVar13] = ' ';
      sVar10 = fread(local_86 + uVar13 + 1,(ulong)uVar5,1,__stream);
      if (sVar10 != 1) goto LAB_00212b9f;
      sc = uVar5 + uVar2 + 3;
    }
    if ((uVar6 & 8) == 0) {
      vocadd2(local_b8,(prpnum)local_b0,objn,(uint)uVar6,local_86,(uint)uVar2,
              local_86 + (uVar13 - 2),(uint)uVar5);
    }
    else {
      vocdel1(local_b8,objn,(char *)&sc,(prpnum)local_b0,0,0,0);
    }
    goto LAB_00212e95;
  }
LAB_00212b9f:
  fclose(__stream);
  return iVar14;
}

Assistant:

int fiorso(voccxdef *vctx, char *fname)
{
    osfildef   *fp;
    objnum      obj;
    uchar      *p;
    uchar      *mut;
    uint        mutsiz;
    uint        oldmutsiz;
    int         propcnt;
    mcmcxdef   *mctx = vctx->voccxmem;
    uchar       buf[sizeof(FIOSAVHDR) + sizeof(FIOSAVVSN)];
    ushort      newsiz;
    int         err = FALSE;
    char        timestamp[26];
    int         version = 0;            /* version ID - 0 = current version */
    int         result;

    /* presume success */
    result = FIORSO_SUCCESS;

    /* open the input file */
    if (!(fp = osfoprb(fname, OSFTSAVE)))
        return FIORSO_FILE_NOT_FOUND;

    /* check for a prefix header - if it's there, skip it */
    if (!osfrb(fp, buf, (int)(sizeof(FIOSAVHDR_PREFIX) + 2))
        && memcmp(buf, FIOSAVHDR_PREFIX, sizeof(FIOSAVHDR_PREFIX)) == 0)
    {
        ulong skip_len;
        
        /*
         *   The prefix header is present - skip it.  The 2-byte value
         *   following the header is the length of the prefix data block
         *   (not including the header), so simply skip the additional
         *   number of bytes specified.  
         */
        skip_len = (ulong)osrp2(buf + sizeof(FIOSAVHDR_PREFIX));
        osfseek(fp, skip_len, OSFSK_CUR);
    }
    else
    {
        /* 
         *   there's no prefix header - seek back to the start of the file
         *   and read the standard header information
         */
        osfseek(fp, 0, OSFSK_SET);
    }

    
    /* read headers and check */
    if (osfrb(fp, buf, (int)(sizeof(FIOSAVHDR) + sizeof(FIOSAVVSN)))
        || memcmp(buf, FIOSAVHDR, (size_t)sizeof(FIOSAVHDR)))
    {
        /* it's not a saved game file */
        result = FIORSO_NOT_SAVE_FILE;
        goto ret_error;
    }

    /* check the version string */
    if (memcmp(buf + sizeof(FIOSAVHDR), FIOSAVVSN,
               (size_t)sizeof(FIOSAVVSN)) == 0)
    {
        /* it's the current version */
        version = 0;
    }
    else if (memcmp(buf + sizeof(FIOSAVHDR), FIOSAVVSN1,
                    (size_t)sizeof(FIOSAVVSN1)) == 0)
    {
        /* it's old version #1 */
        version = 1;
    }
    else
    {
        /* 
         *   this isn't a recognized version - the file must have been
         *   saved by a newer version of the system, so we can't assume we
         *   will be able to parse the format 
         */
        result = FIORSO_BAD_FMT_VSN;
        goto ret_error;
    }
    
    /* 
     *   Read timestamp and check - the game must have been saved by the
     *   same .GAM file that we are now running, because the .SAV file is
     *   written entirely in terms of the contents of the .GAM file; any
     *   change in the .GAM file invalidates the .SAV file. 
     */
    if (osfrb(fp, timestamp, 26)
        || memcmp(timestamp, vctx->voccxtim, (size_t)26))
    {
        result = FIORSO_BAD_GAME_VSN;
        goto ret_error;
    }
    
    /* first revert every object to original (post-compilation) state */
    vocrevert(vctx);

    /* 
     *   the most common error from here on is simply a file read error,
     *   so presume that this is what will happen; if we are successful or
     *   encounter a different error, we'll change the status at that
     *   point 
     */
    result = FIORSO_READ_ERROR;

    /* go through file and load changed objects */
    for (;;)
    {
        /* get the header */
        if (osfrb(fp, buf, 7))
            goto ret_error;

        /* get the object number from the header, and stop if we're done */
        obj = osrp2(buf+1);
        if (obj == MCMONINV)
            break;

        /* if the object was dynamically allocated, recreate it */
        if (buf[0] == 1)
        {
            int     sccnt;
            objnum  sc;
            
            /* create the object */
            mutsiz = osrp2(buf + 3);
            p = mcmalonum(mctx, (ushort)mutsiz, (mcmon)obj);

            /* read the object's contents */
            if (osfrb(fp, p, mutsiz))
                goto ret_error;

            /* get the superclass data (at most one superclass) */
            sccnt = objnsc(p);
            if (sccnt) sc = osrp2(objsc(p));

            /* create inheritance records for the object */
            vociadd(vctx, obj, MCMONINV, sccnt, &sc, VOCIFNEW | VOCIFVOC);

#if 0
            {
                int     wrdcnt;

                /* read the object's vocabulary and add it back */
                if (osfrb(fp, buf, 2))
                    goto ret_error;
                wrdcnt = osrp2(buf);
                while (wrdcnt--)
                {
                    int   len1;
                    int   len2;
                    char  wrd[80];
                    
                    /* read the header */
                    if (osfrb(fp, buf, 6))
                        goto ret_error;
                    len1 = osrp2(buf+2);
                    len2 = osrp2(buf+4);
                    
                    /* read the word text */
                    if (osfrb(fp, wrd, len1 + len2))
                        goto ret_error;
                    
                    /* add the word */
                    vocadd2(vctx, buf[0], obj, buf[1], wrd, len1,
                            wrd + len1, len2);
                }
            }
#endif

        }
        else
        {
            /* get the remaining data from the header */
            propcnt = osrp2(buf + 3);
            mutsiz = osrp2(buf + 5);
        
            /* expand object if it's not big enough for mutsiz */
            p = mcmlck(mctx, (mcmon)obj);
            oldmutsiz = mcmobjsiz(mctx, (mcmon)obj) - objrst(p);
            if (oldmutsiz < mutsiz)
            {
                newsiz = mutsiz - oldmutsiz;
                p = (uchar *)objexp(mctx, obj, &newsiz);
            }
            
            /* reset statistics, and read mutable part from file */
            mut = p + objrst(p);
            objsnp(p, propcnt);
            objsfree(p, mutsiz + objrst(p));
            if (osfrb(fp, mut, mutsiz))
                err = TRUE;
        
            /* reset ignore flags as needed */
            objsetign(mctx, obj);
        }

        /* touch and unlock the object */
        mcmtch(mctx, (mcmon)obj);
        mcmunlck(mctx, (mcmon)obj);
        if (err)
            goto ret_error;
    }
    
    /* read fuses/daemons/alarms */
    if (fiorfda(fp, vctx->voccxdmn, vctx->voccxdmc)
        || fiorfda(fp, vctx->voccxfus, vctx->voccxfuc)
        || fiorfda(fp, vctx->voccxalm, vctx->voccxalc))
        goto ret_error;

    /* read the dynamically added and deleted vocabulary */
    for (;;)
    {
        int     len1;
        int     len2;
        char    wrd[80];
        int     flags;
        int     typ;
        
        /* read the header */
        if (osfrb(fp, buf, 8))
            goto ret_error;

        typ = buf[0];
        flags = buf[1];
        len1 = osrp2(buf+2);
        len2 = osrp2(buf+4);
        obj = osrp2(buf+6);

        /* check to see if this is the end marker */
        if (obj == MCMONINV) break;
        
        /* read the word text */
        if (osfrb(fp, wrd+2, len1))
            goto ret_error;
        if (len2)
        {
            wrd[len1 + 2] = ' ';
            if (osfrb(fp, &wrd[len1 + 3], len2))
                goto ret_error;
            oswp2(wrd, len1 + len2 + 3);
        }
        else
            oswp2(wrd, len1 + 2);
        
        /* add or delete the word as appropriate */
        if (flags & VOCFDEL)
            vocdel1(vctx, obj, (char *)wrd, (prpnum)typ, FALSE, FALSE, FALSE);
        else
            vocadd2(vctx, buf[0], obj, buf[1], (uchar *)wrd+2, len1,
                    (uchar *)wrd+len1, len2);
    }

    /* 
     *   the following was added in save format version "v2.2.1", so skip
     *   it if the save version is older than that 
     */
    if (version != 1)
    {
        /* read the current "Me" object */
        if (osfrb(fp, buf, 2))
            goto ret_error;
        vctx->voccxme = osrp2(buf);
    }

    /* done - close file and return success indication */
    osfcls(fp);
    return FIORSO_SUCCESS;

    /* come here on failure - close file and return error indication */
ret_error:
    osfcls(fp);
    return result;
}